

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

int prf_model_traverse_io(prf_model_t *model,prf_cb_t callback)

{
  int iVar1;
  prf_state_t *state;
  
  state = prf_state_create();
  state->model = model;
  state->traversal_method = 1;
  (state->callback).func = callback.func;
  (state->callback).data = callback.data;
  iVar1 = prf_model_traverse_io_(model->header,state);
  prf_state_destroy(state);
  return iVar1;
}

Assistant:

int
prf_model_traverse_io(
    prf_model_t * model,
    prf_cb_t callback )
{
    prf_state_t * state = NULL;
    int traverse;

    assert( model != NULL && model->header != NULL );

    state = prf_state_create();
    assert( state != NULL );
    state->model = model;
    state->traversal_method = PRF_TRAV_IN_ORDER;
    state->callback = callback;

    traverse = prf_model_traverse_io_( model->header, state );

    prf_state_destroy( state );

    return traverse;
}